

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

bool __thiscall rtosc::AutomationMgr::handleMidi(AutomationMgr *this,int channel,int type,int val)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  AutomationMgr *in_RDI;
  int j;
  int i_2;
  int i_1;
  bool bound_cc;
  int i;
  bool bound_nrpn;
  int vallo;
  int valhi;
  int parlo;
  int parhi;
  int value;
  int par_id;
  bool is_nrpn;
  int local_50;
  int local_4c;
  float in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  byte local_1d;
  
  local_1d = 0;
  local_24 = 0;
  if ((((in_EDX == 6) || (in_EDX == 0x26)) || (in_EDX == 99)) || (in_EDX == 0x62)) {
    setparameternumber(in_RDI,in_EDX,in_ECX);
    local_2c = -1;
    local_30 = -1;
    local_34 = -1;
    local_38 = -1;
    iVar1 = getnrpn(in_RDI,&local_2c,&local_30,&local_34,&local_38);
    if (iVar1 == 0) {
      local_1d = 1;
      local_24 = local_2c * 0x80 + local_30;
      local_28 = local_34 * 0x80 + local_38;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
      for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < in_RDI->nslots;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        if (in_RDI->slots[in_stack_ffffffffffffffc0].midi_nrpn == local_24) {
          in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
          setSlot((AutomationMgr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        }
      }
      if ((in_stack_ffffffffffffffc4 & 0x1000000) != 0) {
        return true;
      }
    }
  }
  else {
    local_24 = in_ESI * 0x80 + in_EDX;
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    for (in_stack_ffffffffffffffb8 = 0.0; (int)in_stack_ffffffffffffffb8 < in_RDI->nslots;
        in_stack_ffffffffffffffb8 = (float)((int)in_stack_ffffffffffffffb8 + 1)) {
      if (in_RDI->slots[(int)in_stack_ffffffffffffffb8].midi_cc == local_24) {
        in_stack_ffffffffffffffbc = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
        setSlot((AutomationMgr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
    }
    if ((in_stack_ffffffffffffffbc & 0x1000000) != 0) {
      return true;
    }
  }
  local_4c = 0;
  while( true ) {
    if (in_RDI->nslots <= local_4c) {
      return false;
    }
    if (in_RDI->slots[local_4c].learning == 1) break;
    local_4c = local_4c + 1;
  }
  in_RDI->slots[local_4c].learning = -1;
  if ((local_1d & 1) == 0) {
    in_RDI->slots[local_4c].midi_cc = local_24;
  }
  else {
    in_RDI->slots[local_4c].midi_nrpn = local_24;
  }
  for (local_50 = 0; local_50 < in_RDI->nslots; local_50 = local_50 + 1) {
    if (1 < in_RDI->slots[local_50].learning) {
      in_RDI->slots[local_50].learning = in_RDI->slots[local_50].learning + -1;
    }
  }
  in_RDI->learn_queue_len = in_RDI->learn_queue_len + -1;
  setSlot((AutomationMgr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  in_RDI->damaged = 1;
  return false;
}

Assistant:

bool AutomationMgr::handleMidi(int channel, int type, int val)
{
    bool is_nrpn = false;
    int par_id = 0;
    int value;
    if((type == C_dataentryhi) || (type == C_dataentrylo)
       || (type == C_nrpnhi) || (type == C_nrpnlo)) { //Process RPN and NRPN by the Master (ignore the chan)
        
        setparameternumber(type, val);

        int parhi = -1, parlo = -1, valhi = -1, vallo = -1;
        if(getnrpn(&parhi, &parlo, &valhi, &vallo) == 0){ //this is NRPN
            is_nrpn = true;
            par_id = (parhi<<7) + parlo;
            value = (valhi<<7) + vallo;
            bool bound_nrpn = false;
            for(int i=0; i<nslots; ++i) {
                if(slots[i].midi_nrpn == par_id) {
                    bound_nrpn = true;
                    setSlot(i, value/16383.0);
                }
            }

        if(bound_nrpn)
            return 1;
        }
        
    }
    else {
        
        par_id = channel*128 + type;

        bool bound_cc = false;
        for(int i=0; i<nslots; ++i) {
            if(slots[i].midi_cc == par_id) {
                bound_cc = true;
                setSlot(i, val/127.0);
            }
        }

        if(bound_cc)
            return 1;
        
    }

    //No bound CC, now to see if there's something to learn
    for(int i=0; i<nslots; ++i) {
        if(slots[i].learning == 1) {
            slots[i].learning = -1;
            if (is_nrpn)
                slots[i].midi_nrpn = par_id;
            else
                slots[i].midi_cc = par_id;
            for(int j=0; j<nslots; ++j)
                if(slots[j].learning > 1)
                    slots[j].learning -= 1;
            learn_queue_len--;
            setSlot(i, val/127.0);
            damaged = 1;
            break;
        }
    }
    return 0;
}